

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

void __thiscall
HighsSymmetryDetection::markCellForRefinement(HighsSymmetryDetection *this,HighsInt cell)

{
  HighsInt HVar1;
  reference pvVar2;
  iterator iVar3;
  iterator iVar4;
  int in_ESI;
  HighsSymmetryDetection *in_RDI;
  undefined4 in_stack_ffffffffffffffc8;
  HighsInt in_stack_ffffffffffffffcc;
  value_type_conflict2 *in_stack_ffffffffffffffd8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffe0;
  
  HVar1 = cellSize(in_RDI,in_stack_ffffffffffffffcc);
  if ((HVar1 != 1) &&
     (pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&in_RDI->cellInRefinementQueue,(long)in_ESI), *pvVar2 == '\0')) {
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&in_RDI->cellInRefinementQueue,(long)in_ESI);
    *pvVar2 = '\x01';
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    iVar3 = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    iVar4 = std::vector<int,_std::allocator<int>_>::end
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    std::
    push_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::greater<int>>
              (iVar3._M_current,iVar4._M_current);
  }
  return;
}

Assistant:

void HighsSymmetryDetection::markCellForRefinement(HighsInt cell) {
  if (cellSize(cell) == 1 || cellInRefinementQueue[cell]) return;

  cellInRefinementQueue[cell] = true;
  refinementQueue.push_back(cell);
  std::push_heap(refinementQueue.begin(), refinementQueue.end(),
                 std::greater<HighsInt>());
}